

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  SRes SVar1;
  ulong uVar2;
  Byte *pBVar3;
  ulong uVar4;
  ulong uVar5;
  CLzmaProps propNew;
  CLzmaProps local_30;
  
  SVar1 = LzmaProps_Decode(&local_30,props,propsSize);
  if ((SVar1 == 0) && (SVar1 = LzmaDec_AllocateProbs2(p,&local_30,alloc), SVar1 == 0)) {
    uVar2 = (ulong)local_30.dicSize;
    uVar4 = 0xfff;
    if (0x3fffff < uVar2) {
      uVar4 = 0xfffff;
    }
    uVar5 = 0x3fffff;
    if (uVar2 < 0x40000000) {
      uVar5 = uVar4;
    }
    uVar4 = ~uVar5 & uVar5 + uVar2;
    if (uVar4 <= uVar2) {
      uVar4 = uVar2;
    }
    if ((p->dic == (Byte *)0x0) || (uVar4 != p->dicBufSize)) {
      (*alloc->Free)(alloc,p->dic);
      p->dic = (Byte *)0x0;
      pBVar3 = (Byte *)(*alloc->Alloc)(alloc,uVar4);
      p->dic = pBVar3;
      if (pBVar3 == (Byte *)0x0) {
        (*alloc->Free)(alloc,p->probs);
        p->probs = (UInt16 *)0x0;
        return 2;
      }
    }
    p->dicBufSize = uVar4;
    (p->prop).lc = local_30.lc;
    (p->prop).lp = local_30.lp;
    (p->prop).pb = local_30.pb;
    (p->prop).dicSize = local_30.dicSize;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)alloc->Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}